

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O3

bool __thiscall OpenMD::FragmentStamp::addBondStamp(FragmentStamp *this,BondStamp *bond)

{
  pointer *pppBVar1;
  iterator __position;
  BondStamp *local_8;
  
  __position._M_current =
       (this->bondStamps_).
       super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->bondStamps_).
      super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_8 = bond;
    std::vector<OpenMD::BondStamp*,std::allocator<OpenMD::BondStamp*>>::
    _M_realloc_insert<OpenMD::BondStamp*const&>
              ((vector<OpenMD::BondStamp*,std::allocator<OpenMD::BondStamp*>> *)&this->bondStamps_,
               __position,&local_8);
  }
  else {
    *__position._M_current = bond;
    pppBVar1 = &(this->bondStamps_).
                super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + 1;
  }
  return true;
}

Assistant:

bool FragmentStamp::addBondStamp(BondStamp* bond) {
    bondStamps_.push_back(bond);
    return true;
  }